

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

int Ivy_NodeCutFindOrAddFilter(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  Ivy_Cut_t *pIVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  short sVar9;
  short sVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  
  uVar4 = pCutNew->uHash;
  if (uVar4 == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0x2ea,"int Ivy_NodeCutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  iVar5 = pCutStore->nCuts;
  lVar12 = (long)iVar5;
  if (0 < lVar12) {
    piVar14 = pCutStore->pCuts[0].pArray;
    lVar15 = 0;
    do {
      uVar2 = pCutStore->pCuts[lVar15].nSize;
      uVar11 = (uint)(short)uVar2;
      if (uVar2 != 0) {
        uVar3 = pCutNew->nSize;
        if (uVar2 == uVar3) {
          if (pCutStore->pCuts[lVar15].uHash == uVar4) {
            if ((short)uVar2 < 1) {
              uVar16 = 0;
            }
            else {
              uVar16 = 0;
              while (piVar14[uVar16] == pCutNew->pArray[uVar16]) {
                uVar16 = uVar16 + 1;
                if (uVar11 == uVar16) {
                  return 1;
                }
              }
            }
            if ((uint)uVar16 == uVar11) {
              return 1;
            }
          }
        }
        else {
          uVar6 = pCutStore->pCuts[lVar15].uHash;
          uVar13 = uVar6 & uVar4;
          if ((short)uVar2 < (short)uVar3) {
            if (uVar13 == uVar6) {
              if ((short)uVar2 < 1) {
                return 1;
              }
              lVar17 = 0;
              while( true ) {
                uVar16 = 0;
                while (pCutStore->pCuts[lVar15].pArray[lVar17] != pCutNew->pArray[uVar16]) {
                  uVar16 = uVar16 + 1;
                  if ((uint)(int)(short)uVar3 == uVar16) goto LAB_00918747;
                }
                if ((int)(short)uVar3 == (uint)uVar16) break;
                lVar17 = lVar17 + 1;
                if (lVar17 == (int)uVar11) {
                  return 1;
                }
              }
            }
          }
          else if (uVar13 == uVar4) {
            if (0 < (short)uVar3) {
              uVar16 = 0;
              do {
                uVar18 = 0;
                while (pCutNew->pArray[uVar16] != piVar14[uVar18]) {
                  uVar18 = uVar18 + 1;
                  if (uVar11 == uVar18) goto LAB_00918747;
                }
                if (uVar11 == (uint)uVar18) goto LAB_00918747;
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar3);
            }
            pCutStore->pCuts[lVar15].nSize = 0;
          }
        }
      }
LAB_00918747:
      lVar15 = lVar15 + 1;
      piVar14 = piVar14 + 9;
    } while (lVar15 != lVar12);
  }
  if (pCutStore->nCutsMax <= iVar5) {
    __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0x317,"int Ivy_NodeCutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  pCutStore->nCuts = iVar5 + 1;
  pCutStore->pCuts[lVar12].uHash = pCutNew->uHash;
  iVar5 = pCutNew->nLatches;
  sVar9 = pCutNew->nSize;
  sVar10 = pCutNew->nSizeMax;
  uVar7 = *(undefined8 *)pCutNew->pArray;
  uVar8 = *(undefined8 *)(pCutNew->pArray + 4);
  piVar14 = pCutStore->pCuts[lVar12].pArray;
  *(undefined8 *)(piVar14 + 2) = *(undefined8 *)(pCutNew->pArray + 2);
  *(undefined8 *)(piVar14 + 4) = uVar8;
  pIVar1 = pCutStore->pCuts + lVar12;
  pIVar1->nLatches = iVar5;
  pIVar1->nSize = sVar9;
  pIVar1->nSizeMax = sVar10;
  *(undefined8 *)pIVar1->pArray = uVar7;
  return 0;
}

Assistant:

int Ivy_NodeCutFindOrAddFilter( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize == pCutNew->nSize )
        {
            if ( pCut->uHash == pCutNew->uHash )
            {
                for ( k = 0; k < pCutNew->nSize; k++ )
                    if ( pCut->pArray[k] != pCutNew->pArray[k] )
                        break;
                if ( k == pCutNew->nSize )
                    return 1;
            }
            continue;
        }
        if ( pCut->nSize < pCutNew->nSize )
        {
            // skip the non-contained cuts
            if ( (pCut->uHash & pCutNew->uHash) != pCut->uHash )
                continue;
            // check containment seriously
            if ( Ivy_CutCheckDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uHash & pCutNew->uHash) != pCutNew->uHash )
            continue;
        // check containment seriously
        if ( Ivy_CutCheckDominance( pCutNew, pCut ) )
        {
            // remove the current cut
//            --pCutStore->nCuts;
//            for ( k = i; k < pCutStore->nCuts; k++ )
//                pCutStore->pCuts[k] = pCutStore->pCuts[k+1];
//            i--;
            pCut->nSize = 0;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}